

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

bc_slist_t * bc_slist_append(bc_slist_t *l,void *data)

{
  _bc_slist_t *p_Var1;
  bc_slist_t *pbVar2;
  bc_slist_t *pbVar3;
  
  pbVar2 = (bc_slist_t *)bc_malloc(0x10);
  pbVar2->data = data;
  pbVar2->next = (_bc_slist_t *)0x0;
  p_Var1 = l;
  if (l != (bc_slist_t *)0x0) {
    do {
      pbVar3 = p_Var1;
      p_Var1 = pbVar3->next;
    } while (p_Var1 != (_bc_slist_t *)0x0);
    pbVar3->next = pbVar2;
    pbVar2 = l;
  }
  return pbVar2;
}

Assistant:

bc_slist_t*
bc_slist_append(bc_slist_t *l, void *data)
{
    bc_slist_t *node = bc_malloc(sizeof(bc_slist_t));
    node->data = data;
    node->next = NULL;
    if (l == NULL) {
        l = node;
    }
    else {
        bc_slist_t *tmp;
        for (tmp = l; tmp->next != NULL; tmp = tmp->next);
        tmp->next = node;
    }
    return l;
}